

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O0

void predict_with_confidence(uncertainty *d,float fx,float *fw)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uchar *in_RCX;
  size_t *siglen;
  float *in_RSI;
  EVP_PKEY_CTX *in_RDI;
  EVP_PKEY_CTX *ctx;
  size_t in_R8;
  float in_XMM0_Da;
  float fVar4;
  float extraout_XMM0_Da;
  float uncertain;
  float sqrtf_ng2;
  float *w;
  
  *(float *)in_RDI = *in_RSI * in_XMM0_Da + *(float *)in_RDI;
  ctx = in_RDI;
  fVar4 = sqrtf(in_RSI[2]);
  fVar1 = *(float *)(*(long *)(in_RDI + 8) + 0x18);
  fVar2 = *(float *)(*(long *)(in_RDI + 8) + 0x14);
  fVar3 = *(float *)(*(long *)(in_RDI + 8) + 0x20);
  sign(ctx,(uchar *)in_RSI,siglen,in_RCX,in_R8);
  *(float *)(in_RDI + 4) =
       (1.0 / ((fVar1 + fVar4) / fVar2 + fVar3)) * extraout_XMM0_Da + *(float *)(in_RDI + 4);
  return;
}

Assistant:

inline void predict_with_confidence(uncertainty& d, const float fx, float& fw)
{
  float* w = &fw;
  d.pred += w[W_XT] * fx;
  float sqrtf_ng2 = sqrtf(w[W_G2]);
  float uncertain = ((d.b.data.ftrl_beta + sqrtf_ng2) / d.b.data.ftrl_alpha + d.b.data.l2_lambda);
  d.score += (1 / uncertain) * sign(fx);
}